

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

wstring * __thiscall
mjs::index_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,uint32_t index)

{
  size_t sVar1;
  uint uVar2;
  wchar_t *__s;
  wchar_t buffer [12];
  wchar_t local_20 [4];
  
  if ((int)this != -1) {
    __s = local_20 + 1;
    local_20[1] = 0;
    do {
      uVar2 = (uint)this;
      __s[-1] = (int)(((ulong)this & 0xffffffff) / 10) * -10 + uVar2 + L'0';
      __s = __s + -1;
      this = (mjs *)(((ulong)this & 0xffffffff) / 10);
    } while (9 < uVar2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = wcslen(__s);
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)__return_storage_ptr__,__s,__s + sVar1);
    return __return_storage_ptr__;
  }
  __assert_fail("index != UINT32_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                ,0x30b,"std::wstring mjs::index_string(uint32_t)");
}

Assistant:

std::wstring index_string(uint32_t index) {
    assert(index != UINT32_MAX);
    wchar_t buffer[12], *p = &buffer[sizeof(buffer)/sizeof(*buffer)];
    *--p = '\0';
    do {
        *--p = '0' + index % 10;
        index /= 10;
    } while (index);
    return std::wstring{p};
}